

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O0

int anon_unknown.dwarf_9840::CheckHeader(FILE *fp)

{
  int iVar1;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  undefined1 local_19;
  FILE *pFStack_18;
  char data_check [5];
  FILE *fp_local;
  
  pFStack_18 = (FILE *)fp;
  fread(&local_1d,1,4,(FILE *)fp);
  local_19 = 0;
  iVar1 = strcmp(&local_1d,"RIFF");
  if (iVar1 == 0) {
    fseek(pFStack_18,4,1);
    fread(&local_1d,1,4,pFStack_18);
    iVar1 = strcmp(&local_1d,"WAVE");
    if (iVar1 == 0) {
      fread(&local_1d,1,4,pFStack_18);
      iVar1 = strcmp(&local_1d,"fmt ");
      if (iVar1 == 0) {
        fread(&local_1d,1,4,pFStack_18);
        if ((((local_1d == '\x10') && (local_1c == '\0')) && (local_1b == '\0')) &&
           (local_1a == '\0')) {
          fread(&local_1d,1,2,pFStack_18);
          if ((local_1d == '\x01') && (local_1c == '\0')) {
            fread(&local_1d,1,2,pFStack_18);
            if ((local_1d == '\x01') && (local_1c == '\0')) {
              fp_local._4_4_ = 1;
            }
            else {
              printf("This function cannot support stereo file\n");
              fp_local._4_4_ = 0;
            }
          }
          else {
            printf("Format ID error.\n");
            fp_local._4_4_ = 0;
          }
        }
        else {
          printf("fmt (2) error.\n");
          fp_local._4_4_ = 0;
        }
      }
      else {
        printf("fmt error.\n");
        fp_local._4_4_ = 0;
      }
    }
    else {
      printf("WAVE error.\n");
      fp_local._4_4_ = 0;
    }
  }
  else {
    printf("RIFF error.\n");
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

static int CheckHeader(FILE *fp) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "RIFF"
  data_check[4] = '\0';
  if (0 != strcmp(data_check, "RIFF")) {
    printf("RIFF error.\n");
    return 0;
  }
  fseek(fp, 4, SEEK_CUR);
  fread(data_check, 1, 4, fp);  // "WAVE"
  if (0 != strcmp(data_check, "WAVE")) {
    printf("WAVE error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // "fmt "
  if (0 != strcmp(data_check, "fmt ")) {
    printf("fmt error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // 1 0 0 0
  if (!(16 == data_check[0] && 0 == data_check[1] &&
      0 == data_check[2] && 0 == data_check[3])) {
    printf("fmt (2) error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("Format ID error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("This function cannot support stereo file\n");
    return 0;
  }
  return 1;
}